

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index)

{
  LocalizationInfo *pLVar1;
  NFRuleSet *pNVar2;
  int iVar3;
  undefined4 extraout_var;
  NFRuleSet **ppNVar4;
  bool bVar5;
  ConstChar16Ptr local_28 [3];
  
  pLVar1 = this->localizations;
  if (pLVar1 == (LocalizationInfo *)0x0) {
    ppNVar4 = this->fRuleSets;
    if (ppNVar4 != (NFRuleSet **)0x0) {
      (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
           (_func_int **)&PTR__UnicodeString_003b1268;
      (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
      for (; pNVar2 = *ppNVar4, pNVar2 != (NFRuleSet *)0x0; ppNVar4 = ppNVar4 + 1) {
        if ((pNVar2->fIsPublic != '\0') && (bVar5 = index == 0, index = index + -1, bVar5)) {
          UnicodeString::setTo(__return_storage_ptr__,&pNVar2->name);
          return __return_storage_ptr__;
        }
      }
      UnicodeString::~UnicodeString(__return_storage_ptr__);
    }
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003b1268;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  }
  else {
    iVar3 = (*pLVar1->_vptr_LocalizationInfo[4])(pLVar1,(ulong)(uint)index);
    local_28[0].p_ = (char16_t *)CONCAT44(extraout_var,iVar3);
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_28,-1);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
RuleBasedNumberFormat::getRuleSetName(int32_t index) const
{
    if (localizations) {
        UnicodeString string(TRUE, localizations->getRuleSetName(index), (int32_t)-1);
        return string;
    }
    else if (fRuleSets) {
        UnicodeString result;
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            NFRuleSet* rs = *p;
            if (rs->isPublic()) {
                if (--index == -1) {
                    rs->getName(result);
                    return result;
                }
            }
        }
    }
    UnicodeString empty;
    return empty;
}